

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Part.cpp
# Opt level: O0

void __thiscall MT32Emu::Part::Part(Part *this,Synth *useSynth,uint usePartNum)

{
  uint usePartNum_local;
  Synth *useSynth_local;
  Part *this_local;
  
  this->_vptr_Part = (_func_int **)&PTR__Part_00213948;
  PolyList::PolyList(&this->activePolys);
  this->synth = useSynth;
  this->partNum = usePartNum;
  this->patchCache[0].dirty = true;
  this->holdpedal = false;
  this->patchTemp = this->synth->mt32ram->patchTemp + this->partNum;
  if (usePartNum == 8) {
    this->timbreTemp = (TimbreParam *)0x0;
  }
  else {
    sprintf(this->name,"Part %d",(ulong)(this->partNum + 1));
    this->timbreTemp = this->synth->mt32ram->timbreTemp + this->partNum;
  }
  this->currentInstr[0] = '\0';
  this->currentInstr[10] = '\0';
  this->volumeOverride = 0xff;
  this->modulation = '\0';
  this->expression = 'd';
  this->pitchBend = 0;
  this->activePartialCount = 0;
  this->activeNonReleasingPolyCount = 0;
  memset(this->patchCache,0,0x1a0);
  return;
}

Assistant:

Part::Part(Synth *useSynth, unsigned int usePartNum) {
	synth = useSynth;
	partNum = usePartNum;
	patchCache[0].dirty = true;
	holdpedal = false;
	patchTemp = &synth->mt32ram.patchTemp[partNum];
	if (usePartNum == 8) {
		// Nasty hack for rhythm
		timbreTemp = NULL;
	} else {
		sprintf(name, "Part %d", partNum + 1);
		timbreTemp = &synth->mt32ram.timbreTemp[partNum];
	}
	currentInstr[0] = 0;
	currentInstr[10] = 0;
	volumeOverride = 255;
	modulation = 0;
	expression = 100;
	pitchBend = 0;
	activePartialCount = 0;
	activeNonReleasingPolyCount = 0;
	memset(patchCache, 0, sizeof(patchCache));
}